

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

void prsdef(prscxdef *ctx,tokdef *tok,int typ)

{
  char *pcVar1;
  toktdef *ptVar2;
  ushort uVar3;
  int iVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int typ_00;
  uint uVar5;
  
  ptVar2 = (&ctx->prscxstab)[typ == 0xc];
  typ_00 = typ;
  if ((tok->toktyp == 0x38) && ((tok->toksym).tokstyp == '\0')) {
    if (ptVar2 == (toktdef *)0x0) goto LAB_0011e846;
    pcVar1 = tok->toknam;
    iVar4 = (*ptVar2->toktfsea)(ptVar2,pcVar1,tok->toklen,tok->tokhash,&tok->toksym);
    typ_00 = extraout_EDX;
    if (iVar4 == 0) {
      (*ptVar2->toktfadd)(ptVar2,pcVar1,tok->toklen,0,0,tok->tokhash);
      (*ptVar2->toktfsea)(ptVar2,pcVar1,tok->toklen,tok->tokhash,&tok->toksym);
      typ_00 = extraout_EDX_00;
    }
  }
  if ((tok->toktyp != 0x38) || ((tok->toksym).tokstyp != '\0')) {
    return;
  }
  if (ptVar2 == (toktdef *)0x0) {
LAB_0011e846:
    errsigf(ctx->prscxerr,"TADS",0x156);
  }
  switch(typ) {
  case 3:
    uVar5 = ctx->prscxprp;
    ctx->prscxprp = uVar5 + 1;
    (tok->toksym).toksval = (ushort)uVar5;
    break;
  case 7:
  case 8:
    prsdefobj(ctx,tok,typ_00);
    break;
  case 10:
    uVar3 = ctx->prscxextc;
    ctx->prscxextc = uVar3 + 1;
    goto LAB_0011e823;
  case 0xc:
    uVar5 = emtglbl(ctx->prscxemt);
    uVar3 = (ushort)uVar5;
LAB_0011e823:
    (tok->toksym).toksval = uVar3;
  }
  (tok->toksym).tokstyp = (uchar)typ;
  (*ptVar2->toktfset)(ptVar2,&tok->toksym);
  return;
}

Assistant:

void prsdef(prscxdef *ctx, tokdef *tok, int typ)
{
    toktdef *tab;
    
    tab = (typ == TOKSTLABEL ? ctx->prscxgtab : ctx->prscxstab);
    
    if (tok->toktyp == TOKTSYMBOL && tok->toksym.tokstyp == TOKSTUNK)
    {
        if (!tab) errsig(ctx->prscxerr, ERR_UNDFSYM);
                         
        /* see if it's been defined since we last looked */
        if (!(*tab->toktfsea)(tab, tok->toknam, tok->toklen,
                              tok->tokhash, &tok->toksym))
        {
            /* still not defined; add to the symbol table */
            (*tab->toktfadd)(tab, tok->toknam, tok->toklen,
                             TOKSTUNK, 0, tok->tokhash);
            (*tab->toktfsea)(tab, tok->toknam, tok->toklen,
                             tok->tokhash, &tok->toksym);
        }
    }
    if (tok->toktyp == TOKTSYMBOL && tok->toksym.tokstyp == TOKSTUNK)
    {
        if (!tab) errsig(ctx->prscxerr, ERR_UNDFSYM);

        switch(typ)
        {
        case TOKSTPROP:
            tok->toksym.toksval = ctx->prscxprp++;
            break;

        case TOKSTFWDOBJ:
        case TOKSTFWDFN:
            /* fill in the symbol with the object information */
            prsdefobj(ctx, tok, typ);
            break;

        case TOKSTEXTERN:
            tok->toksym.toksval = ctx->prscxextc++;
            break;
            
        case TOKSTLABEL:
            tok->toksym.toksval = emtglbl(ctx->prscxemt);
            break;
        }
        tok->toksym.tokstyp = typ;
        (*tab->toktfset)(tab, &tok->toksym);
    }
}